

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire.c
# Opt level: O0

uint64_t nn_getll(uint8_t *buf)

{
  uint8_t *buf_local;
  
  return (ulong)*buf << 0x38 | (ulong)buf[1] << 0x30 | (ulong)buf[2] << 0x28 | (ulong)buf[3] << 0x20
         | (ulong)buf[4] << 0x18 | (ulong)buf[5] << 0x10 | (ulong)buf[6] << 8 | (ulong)buf[7];
}

Assistant:

uint64_t nn_getll (const uint8_t *buf)
{
    return (((uint64_t) buf [0]) << 56) |
           (((uint64_t) buf [1]) << 48) |
           (((uint64_t) buf [2]) << 40) |
           (((uint64_t) buf [3]) << 32) |
           (((uint64_t) buf [4]) << 24) |
           (((uint64_t) buf [5]) << 16) |
           (((uint64_t) buf [6]) << 8) |
           (((uint64_t) buf [7] << 0));
}